

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer_factory.cc
# Opt level: O0

unique_ptr<sentencepiece::TrainerInterface,_std::default_delete<sentencepiece::TrainerInterface>_>
__thiscall
sentencepiece::TrainerFactory::Create
          (TrainerFactory *this,TrainerSpec *trainer_spec,NormalizerSpec *normalizer_spec,
          NormalizerSpec *denormalizer_spec)

{
  TrainerSpec_ModelType TVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  unique_ptr<sentencepiece::unigram::Trainer,_std::default_delete<sentencepiece::unigram::Trainer>_>
  local_68 [3];
  byte local_4a;
  Die local_49;
  unique_ptr<sentencepiece::character::Trainer,_std::default_delete<sentencepiece::character::Trainer>_>
  local_48;
  unique_ptr<sentencepiece::word::Trainer,_std::default_delete<sentencepiece::word::Trainer>_>
  local_40;
  unique_ptr<sentencepiece::bpe::Trainer,_std::default_delete<sentencepiece::bpe::Trainer>_>
  local_38;
  unique_ptr<sentencepiece::unigram::Trainer,_std::default_delete<sentencepiece::unigram::Trainer>_>
  local_30;
  NormalizerSpec *local_28;
  NormalizerSpec *denormalizer_spec_local;
  NormalizerSpec *normalizer_spec_local;
  TrainerSpec *trainer_spec_local;
  
  local_28 = denormalizer_spec;
  denormalizer_spec_local = normalizer_spec;
  normalizer_spec_local = (NormalizerSpec *)trainer_spec;
  trainer_spec_local = (TrainerSpec *)this;
  TVar1 = TrainerSpec::model_type(trainer_spec);
  switch(TVar1) {
  case TrainerSpec_ModelType_UNIGRAM:
    std::
    make_unique<sentencepiece::unigram::Trainer,sentencepiece::TrainerSpec_const&,sentencepiece::NormalizerSpec_const&,sentencepiece::NormalizerSpec_const&>
              ((TrainerSpec *)&local_30,normalizer_spec_local,denormalizer_spec_local);
    std::
    unique_ptr<sentencepiece::TrainerInterface,std::default_delete<sentencepiece::TrainerInterface>>
    ::
    unique_ptr<sentencepiece::unigram::Trainer,std::default_delete<sentencepiece::unigram::Trainer>,void>
              ((unique_ptr<sentencepiece::TrainerInterface,std::default_delete<sentencepiece::TrainerInterface>>
                *)this,&local_30);
    std::
    unique_ptr<sentencepiece::unigram::Trainer,_std::default_delete<sentencepiece::unigram::Trainer>_>
    ::~unique_ptr(&local_30);
    break;
  case TrainerSpec_ModelType_BPE:
    std::
    make_unique<sentencepiece::bpe::Trainer,sentencepiece::TrainerSpec_const&,sentencepiece::NormalizerSpec_const&,sentencepiece::NormalizerSpec_const&>
              ((TrainerSpec *)&local_38,normalizer_spec_local,denormalizer_spec_local);
    std::
    unique_ptr<sentencepiece::TrainerInterface,std::default_delete<sentencepiece::TrainerInterface>>
    ::unique_ptr<sentencepiece::bpe::Trainer,std::default_delete<sentencepiece::bpe::Trainer>,void>
              ((unique_ptr<sentencepiece::TrainerInterface,std::default_delete<sentencepiece::TrainerInterface>>
                *)this,&local_38);
    std::unique_ptr<sentencepiece::bpe::Trainer,_std::default_delete<sentencepiece::bpe::Trainer>_>
    ::~unique_ptr(&local_38);
    break;
  case TrainerSpec_ModelType_WORD:
    std::
    make_unique<sentencepiece::word::Trainer,sentencepiece::TrainerSpec_const&,sentencepiece::NormalizerSpec_const&,sentencepiece::NormalizerSpec_const&>
              ((TrainerSpec *)&local_40,normalizer_spec_local,denormalizer_spec_local);
    std::
    unique_ptr<sentencepiece::TrainerInterface,std::default_delete<sentencepiece::TrainerInterface>>
    ::
    unique_ptr<sentencepiece::word::Trainer,std::default_delete<sentencepiece::word::Trainer>,void>
              ((unique_ptr<sentencepiece::TrainerInterface,std::default_delete<sentencepiece::TrainerInterface>>
                *)this,&local_40);
    std::
    unique_ptr<sentencepiece::word::Trainer,_std::default_delete<sentencepiece::word::Trainer>_>::
    ~unique_ptr(&local_40);
    break;
  case TrainerSpec_ModelType_CHAR:
    std::
    make_unique<sentencepiece::character::Trainer,sentencepiece::TrainerSpec_const&,sentencepiece::NormalizerSpec_const&,sentencepiece::NormalizerSpec_const&>
              ((TrainerSpec *)&local_48,normalizer_spec_local,denormalizer_spec_local);
    std::
    unique_ptr<sentencepiece::TrainerInterface,std::default_delete<sentencepiece::TrainerInterface>>
    ::
    unique_ptr<sentencepiece::character::Trainer,std::default_delete<sentencepiece::character::Trainer>,void>
              ((unique_ptr<sentencepiece::TrainerInterface,std::default_delete<sentencepiece::TrainerInterface>>
                *)this,&local_48);
    std::
    unique_ptr<sentencepiece::character::Trainer,_std::default_delete<sentencepiece::character::Trainer>_>
    ::~unique_ptr(&local_48);
    break;
  default:
    iVar2 = sentencepiece::logging::GetMinLogLevel();
    local_4a = 0;
    if (iVar2 < 4) {
      error::Die::Die(&local_49,true);
      local_4a = 1;
      pcVar3 = logging::BaseName("src/trainer_factory.cc");
      poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2e);
      poVar4 = std::operator<<(poVar4,") ");
      poVar4 = std::operator<<(poVar4,"LOG(");
      poVar4 = std::operator<<(poVar4,"FATAL");
      poVar4 = std::operator<<(poVar4,") ");
      poVar4 = std::operator<<(poVar4,"Unknown model_type: ");
      TVar1 = TrainerSpec::model_type((TrainerSpec *)normalizer_spec_local);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,TVar1);
      error::Die::operator&(&local_49,poVar4);
    }
    if ((local_4a & 1) != 0) {
      error::Die::~Die(&local_49);
    }
    std::
    make_unique<sentencepiece::unigram::Trainer,sentencepiece::TrainerSpec_const&,sentencepiece::NormalizerSpec_const&,sentencepiece::NormalizerSpec_const&>
              ((TrainerSpec *)local_68,normalizer_spec_local,denormalizer_spec_local);
    std::
    unique_ptr<sentencepiece::TrainerInterface,std::default_delete<sentencepiece::TrainerInterface>>
    ::
    unique_ptr<sentencepiece::unigram::Trainer,std::default_delete<sentencepiece::unigram::Trainer>,void>
              ((unique_ptr<sentencepiece::TrainerInterface,std::default_delete<sentencepiece::TrainerInterface>>
                *)this,local_68);
    std::
    unique_ptr<sentencepiece::unigram::Trainer,_std::default_delete<sentencepiece::unigram::Trainer>_>
    ::~unique_ptr(local_68);
  }
  return (__uniq_ptr_data<sentencepiece::TrainerInterface,_std::default_delete<sentencepiece::TrainerInterface>,_true,_true>
          )(__uniq_ptr_data<sentencepiece::TrainerInterface,_std::default_delete<sentencepiece::TrainerInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TrainerInterface> TrainerFactory::Create(
    const TrainerSpec &trainer_spec, const NormalizerSpec &normalizer_spec,
    const NormalizerSpec &denormalizer_spec) {
  switch (trainer_spec.model_type()) {
    case TrainerSpec::UNIGRAM:
      return std::make_unique<unigram::Trainer>(trainer_spec, normalizer_spec,
                                                denormalizer_spec);
      break;
    case TrainerSpec::BPE:
      return std::make_unique<bpe::Trainer>(trainer_spec, normalizer_spec,
                                            denormalizer_spec);
      break;
    case TrainerSpec::WORD:
      return std::make_unique<word::Trainer>(trainer_spec, normalizer_spec,
                                             denormalizer_spec);
      break;
    case TrainerSpec::CHAR:
      return std::make_unique<character::Trainer>(trainer_spec, normalizer_spec,
                                                  denormalizer_spec);
      break;
    default:
      LOG(FATAL) << "Unknown model_type: " << trainer_spec.model_type();
      break;
  }

  return std::make_unique<unigram::Trainer>(trainer_spec, normalizer_spec,
                                            denormalizer_spec);
}